

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void sse::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  auVar2 = _DAT_00123320;
  if (outY != outYEnd) {
    uVar4 = (ulong)totalSimdWidth;
    puVar7 = outY + uVar4 + 2;
    do {
      puVar3 = outY;
      puVar6 = inY;
      if (totalSimdWidth != 0) {
        uVar5 = 0;
        do {
          auVar1 = vpshufb_avx(*(undefined1 (*) [16])(inY + uVar5),auVar2);
          *(undefined1 (*) [16])(outY + uVar5) = auVar1;
          uVar5 = uVar5 + simdWidth;
        } while (uVar4 != uVar5);
        puVar6 = inY + uVar5;
        puVar3 = outY + uVar4;
      }
      if ((nonSimdWidth != 0) && (puVar3 != outY + uVar4 + nonSimdWidth)) {
        uVar5 = 0;
        do {
          puVar7[uVar5] = puVar6[uVar5];
          puVar7[uVar5 - 1] = puVar6[uVar5 + 1];
          puVar7[uVar5 - 2] = puVar6[uVar5 + 2];
          uVar5 = uVar5 + colorCount;
        } while (nonSimdWidth != uVar5);
      }
      outY = outY + rowSizeOut;
      inY = inY + rowSizeIn;
      puVar7 = puVar7 + rowSizeOut;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm_set_epi8(15, 12, 13, 14, 9, 10, 11, 6, 7, 8, 3, 4, 5, 0, 1, 2);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm_loadu_si128( src );
                result = _mm_shuffle_epi8( result, ctrl );
                _mm_storeu_si128( dst, result );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }